

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

string * __thiscall
httplib::detail::make_content_range_header_field_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,size_t offset,size_t length,
          size_t content_length)

{
  bool bVar1;
  char cVar2;
  detail *pdVar3;
  size_t sVar4;
  char cVar5;
  detail *pdVar6;
  string __str;
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"bytes ","");
  cVar5 = '\x01';
  if ((detail *)0x9 < this) {
    pdVar6 = this;
    cVar2 = '\x04';
    do {
      cVar5 = cVar2;
      if (pdVar6 < (detail *)0x64) {
        cVar5 = cVar5 + -2;
        goto LAB_001420b0;
      }
      if (pdVar6 < (detail *)0x3e8) {
        cVar5 = cVar5 + -1;
        goto LAB_001420b0;
      }
      if (pdVar6 < (detail *)0x2710) goto LAB_001420b0;
      bVar1 = (detail *)0x1869f < pdVar6;
      pdVar6 = (detail *)((ulong)pdVar6 / 10000);
      cVar2 = cVar5 + '\x04';
    } while (bVar1);
    cVar5 = cVar5 + '\x01';
  }
LAB_001420b0:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,(unsigned_long)this);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pdVar6 = this + (offset - 1);
  cVar5 = '\x01';
  if ((detail *)0x9 < pdVar6) {
    pdVar3 = pdVar6;
    cVar2 = '\x04';
    do {
      cVar5 = cVar2;
      if (pdVar3 < (detail *)0x64) {
        cVar5 = cVar5 + -2;
        goto LAB_00142170;
      }
      if (pdVar3 < (detail *)0x3e8) {
        cVar5 = cVar5 + -1;
        goto LAB_00142170;
      }
      if (pdVar3 < (detail *)0x2710) goto LAB_00142170;
      bVar1 = (detail *)0x1869f < pdVar3;
      pdVar3 = (detail *)((ulong)pdVar3 / 10000);
      cVar2 = cVar5 + '\x04';
    } while (bVar1);
    cVar5 = cVar5 + '\x01';
  }
LAB_00142170:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,(unsigned_long)pdVar6);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cVar5 = '\x01';
  if (9 < length) {
    sVar4 = length;
    cVar2 = '\x04';
    do {
      cVar5 = cVar2;
      if (sVar4 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00142224;
      }
      if (sVar4 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00142224;
      }
      if (sVar4 < 10000) goto LAB_00142224;
      bVar1 = 99999 < sVar4;
      sVar4 = sVar4 / 10000;
      cVar2 = cVar5 + '\x04';
    } while (bVar1);
    cVar5 = cVar5 + '\x01';
  }
LAB_00142224:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_50,local_48,length);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string make_content_range_header_field(size_t offset, size_t length,
                                                   size_t content_length) {
  std::string field = "bytes ";
  field += std::to_string(offset);
  field += "-";
  field += std::to_string(offset + length - 1);
  field += "/";
  field += std::to_string(content_length);
  return field;
}